

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *rhs,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator,bool copyConstStrings)

{
  Type TVar1;
  SizeType SVar2;
  Ch *str;
  StringRefType local_68;
  uint local_54;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGStack_50;
  SizeType i_1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *re;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *le;
  SizeType count_1;
  SizeType i;
  Member *rm;
  Member *lm;
  SizeType count;
  bool copyConstStrings_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *rhs_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  
  lm._7_1_ = copyConstStrings;
  _count = allocator;
  allocator_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)rhs;
  rhs_local = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this;
  TVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetType(rhs);
  if (TVar1 == kObjectType) {
    lm._0_4_ = *(uint *)&allocator_local->chunkHead_;
    rm = (Member *)MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(_count,(ulong)(uint)lm << 5)
    ;
    _count_1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetMembersPointer((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    *)allocator_local);
    for (le._4_4_ = 0; le._4_4_ < (uint)lm; le._4_4_ = le._4_4_ + 1) {
      GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)(rm + le._4_4_),&_count_1[le._4_4_].name,_count,(bool)(lm._7_1_ & 1));
      GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&rm[le._4_4_].value,&_count_1[le._4_4_].value,_count,(bool)(lm._7_1_ & 1));
    }
    *(undefined2 *)(this + 0xe) = 3;
    *(uint *)(this + 4) = (uint)lm;
    *(uint *)this = (uint)lm;
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetMembersPointer((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)this,rm);
  }
  else if (TVar1 == kArrayType) {
    le._0_4_ = *(uint *)&allocator_local->chunkHead_;
    re = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *)MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(_count,(ulong)(uint)le << 4);
    pGStack_50 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetElementsPointer
                           ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)allocator_local);
    for (local_54 = 0; local_54 < (uint)le; local_54 = local_54 + 1) {
      GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)(re + local_54),pGStack_50 + local_54,_count,(bool)(lm._7_1_ & 1));
    }
    *(undefined2 *)(this + 0xe) = 4;
    *(uint *)(this + 4) = (uint)le;
    *(uint *)this = (uint)le;
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetElementsPointer((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)this,re);
  }
  else if (TVar1 == kStringType) {
    if ((*(short *)((long)&allocator_local->chunk_capacity_ + 6) == 0x405) && ((lm._7_1_ & 1) == 0))
    {
      *(undefined2 *)(this + 0xe) = *(undefined2 *)((long)&allocator_local->chunk_capacity_ + 6);
      *(ChunkHeader **)this = allocator_local->chunkHead_;
      *(size_t *)(this + 8) = allocator_local->chunk_capacity_;
    }
    else {
      str = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)allocator_local);
      SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetStringLength((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)allocator_local);
      StringRef<char>((rapidjson *)&local_68,str,(ulong)SVar2);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetStringRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)this,&local_68,_count);
    }
  }
  else {
    *(undefined2 *)(this + 0xe) = *(undefined2 *)((long)&allocator_local->chunk_capacity_ + 6);
    *(ChunkHeader **)this = allocator_local->chunkHead_;
    *(size_t *)(this + 8) = allocator_local->chunk_capacity_;
  }
  return;
}

Assistant:

GenericValue(const GenericValue<Encoding,SourceAllocator>& rhs, Allocator& allocator, bool copyConstStrings = false) {
        switch (rhs.GetType()) {
        case kObjectType: {
                SizeType count = rhs.data_.o.size;
                Member* lm = reinterpret_cast<Member*>(allocator.Malloc(count * sizeof(Member)));
                const typename GenericValue<Encoding,SourceAllocator>::Member* rm = rhs.GetMembersPointer();
                for (SizeType i = 0; i < count; i++) {
                    new (&lm[i].name) GenericValue(rm[i].name, allocator, copyConstStrings);
                    new (&lm[i].value) GenericValue(rm[i].value, allocator, copyConstStrings);
                }
                data_.f.flags = kObjectFlag;
                data_.o.size = data_.o.capacity = count;
                SetMembersPointer(lm);
            }
            break;
        case kArrayType: {
                SizeType count = rhs.data_.a.size;
                GenericValue* le = reinterpret_cast<GenericValue*>(allocator.Malloc(count * sizeof(GenericValue)));
                const GenericValue<Encoding,SourceAllocator>* re = rhs.GetElementsPointer();
                for (SizeType i = 0; i < count; i++)
                    new (&le[i]) GenericValue(re[i], allocator, copyConstStrings);
                data_.f.flags = kArrayFlag;
                data_.a.size = data_.a.capacity = count;
                SetElementsPointer(le);
            }
            break;
        case kStringType:
            if (rhs.data_.f.flags == kConstStringFlag && !copyConstStrings) {
                data_.f.flags = rhs.data_.f.flags;
                data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            }
            else
                SetStringRaw(StringRef(rhs.GetString(), rhs.GetStringLength()), allocator);
            break;
        default:
            data_.f.flags = rhs.data_.f.flags;
            data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            break;
        }
    }